

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O1

int xmlDictOwns(xmlDictPtr dict,xmlChar *str)

{
  xmlDictStringsPtr_conflict pxVar1;
  
  while( true ) {
    if (dict == (xmlDictPtr)0x0) {
      return -1;
    }
    if (str == (xmlChar *)0x0) break;
    for (pxVar1 = dict->strings; pxVar1 != (xmlDictStringsPtr_conflict)0x0; pxVar1 = pxVar1->next) {
      if ((pxVar1->array <= str) && (str <= pxVar1->free)) {
        return 1;
      }
    }
    dict = dict->subdict;
    if (dict == (_xmlDict *)0x0) {
      return 0;
    }
  }
  return -1;
}

Assistant:

int
xmlDictOwns(xmlDictPtr dict, const xmlChar *str) {
    xmlDictStringsPtr pool;

    if ((dict == NULL) || (str == NULL))
	return(-1);
    pool = dict->strings;
    while (pool != NULL) {
        if ((str >= &pool->array[0]) && (str <= pool->free))
	    return(1);
	pool = pool->next;
    }
    if (dict->subdict)
        return(xmlDictOwns(dict->subdict, str));
    return(0);
}